

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::ifelse<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool folded)

{
  __index_type *__return_storage_ptr___00;
  optional<wasm::Name> oVar1;
  bool bVar2;
  __optional_ne_t<wasm::Name,_wasm::Name> _Var3;
  size_t sVar4;
  Err *pEVar5;
  HeapType *pHVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  Result<wasm::Ok> local_538;
  allocator<char> local_509;
  string local_508;
  Err local_4e8;
  undefined1 local_4c8 [8];
  optional<wasm::Name> id2;
  string local_4a8;
  Err local_488;
  basic_string_view<char,_std::char_traits<char>_> local_468;
  allocator<char> local_451;
  string local_450;
  Err local_430;
  allocator<char> local_409;
  string local_408;
  Err local_3e8;
  Err local_3c8;
  Err *local_3a8;
  Err *err_5;
  Result<wasm::Ok> _val_5;
  Err *err_4;
  Result<wasm::Ok> _val_4;
  string local_320;
  Err local_300;
  undefined1 local_2e0 [8];
  optional<wasm::Name> id1;
  allocator<char> local_2a1;
  string local_2a0;
  Err local_280;
  Err local_260;
  Err *local_240;
  Err *err_3;
  Result<wasm::Ok> _val_3;
  string local_208;
  Err local_1e8;
  basic_string_view<char,_std::char_traits<char>_> local_1c8;
  Err local_1b8;
  Err *local_198;
  Err *err_2;
  __index_type local_188;
  undefined7 uStack_187;
  size_t sStack_180;
  char *local_178;
  undefined1 local_170 [8];
  Result<wasm::Ok> _val_2;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Err local_f0;
  Err *local_d0;
  Err *err;
  undefined1 local_b8 [8];
  Result<wasm::HeapType> _val;
  Result<wasm::HeapType> type;
  optional<wasm::Name> label;
  Index local_30;
  size_t pos;
  bool folded_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  ParseModuleTypesCtx *ctx_local;
  
  sVar4 = Lexer::getPos(&ctx->in);
  if (folded) {
    bVar7 = sv("if",2);
    bVar2 = Lexer::takeSExprStart(&ctx->in,bVar7);
    if (!bVar2) goto LAB_024679fe;
  }
  if (!folded) {
    bVar7 = sv("if",2);
    bVar2 = Lexer::takeKeyword(&ctx->in,bVar7);
    if (!bVar2) {
LAB_024679fe:
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  Lexer::takeID((optional<wasm::Name> *)
                ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20),&ctx->in);
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20);
  blocktype<wasm::WATParser::ParseModuleTypesCtx>
            ((Result<wasm::HeapType> *)__return_storage_ptr___00,ctx);
  Result<wasm::HeapType>::Result
            ((Result<wasm::HeapType> *)local_b8,(Result<wasm::HeapType> *)__return_storage_ptr___00)
  ;
  local_d0 = Result<wasm::HeapType>::getErr((Result<wasm::HeapType> *)local_b8);
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _36_1_ = local_d0 != (Err *)0x0;
  if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
    wasm::Err::Err(&local_f0,local_d0);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_f0);
    wasm::Err::~Err(&local_f0);
  }
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _37_3_ = 0;
  Result<wasm::HeapType>::~Result((Result<wasm::HeapType> *)local_b8);
  if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ != 0) goto LAB_02468a86;
  if (folded) {
    foldedinstrs<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Ok> *)&err_1,ctx);
    pEVar5 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
    if (pEVar5 != (Err *)0x0) {
      wasm::Err::Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar5);
      MaybeResult<wasm::Ok>::MaybeResult
                (__return_storage_ptr__,
                 (Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      wasm::Err::~Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar5 != (Err *)0x0;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ != 0) goto LAB_02468a86;
    NullInstrParserCtx::setSrcLoc((NullInstrParserCtx *)ctx,annotations);
  }
  local_30 = (Index)sVar4;
  local_178 = label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str;
  local_188 = type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
              super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
              super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
              super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
              super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
              super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_index;
  uStack_187 = type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._33_7_;
  sStack_180 = label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len
  ;
  pHVar6 = Result<wasm::HeapType>::operator*
                     ((Result<wasm::HeapType> *)
                      ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                              super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                              super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                              super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20));
  err_2 = (Err *)pHVar6->id;
  oVar1.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str =
       (char *)sStack_180;
  oVar1.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len = _local_188
  ;
  oVar1.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._16_8_ = local_178;
  NullInstrParserCtx::makeIf<wasm::HeapType>
            ((Result<wasm::Ok> *)local_170,(NullInstrParserCtx *)ctx,local_30,annotations,oVar1,
             (HeapType)err_2);
  local_198 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_170);
  bVar2 = local_198 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_1b8,local_198);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_1b8);
    wasm::Err::~Err(&local_1b8);
  }
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _37_3_ = 0;
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _36_1_ = bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_170);
  if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ != 0) goto LAB_02468a86;
  if (folded) {
    local_1c8 = sv("then",4);
    bVar2 = Lexer::takeSExprStart(&ctx->in,local_1c8);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"expected \'then\' before if instructions",
                 (allocator<char> *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
      Lexer::err(&local_1e8,&ctx->in,&local_208);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_1e8);
      wasm::Err::~Err(&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
      goto LAB_02468a86;
    }
  }
  instrs<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Ok> *)&err_3,ctx);
  local_240 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_3);
  bVar2 = local_240 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_260,local_240);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_260);
    wasm::Err::~Err(&local_260);
  }
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _37_3_ = 0;
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _36_1_ = bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_3);
  if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ != 0) goto LAB_02468a86;
  if ((folded) && (bVar2 = Lexer::takeRParen(&ctx->in), !bVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"expected \')\' at end of then block",&local_2a1);
    Lexer::err(&local_280,&ctx->in,&local_2a0);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_280);
    wasm::Err::~Err(&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
    goto LAB_02468a86;
  }
  if (folded) {
    bVar7 = sv("else",4);
    bVar2 = Lexer::takeSExprStart(&ctx->in,bVar7);
    if (!bVar2) goto LAB_02468175;
LAB_024681de:
    Lexer::takeID((optional<wasm::Name> *)local_2e0,&ctx->in);
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_2e0);
    if ((bVar2) &&
       (_Var3 = std::operator!=((optional<wasm::Name> *)local_2e0,
                                (optional<wasm::Name> *)
                                ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                                        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20)),
       _Var3)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_320,"else label does not match if label",
                 (allocator<char> *)
                 ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
      Lexer::err(&local_300,&ctx->in,&local_320);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_300);
      wasm::Err::~Err(&local_300);
      std::__cxx11::string::~string((string *)&local_320);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
      goto LAB_02468a86;
    }
    NullInstrParserCtx::visitElse((Result<wasm::Ok> *)&err_4,(NullInstrParserCtx *)ctx);
    pEVar5 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_4);
    if (pEVar5 != (Err *)0x0) {
      wasm::Err::Err((Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar5);
      MaybeResult<wasm::Ok>::MaybeResult
                (__return_storage_ptr__,
                 (Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      wasm::Err::~Err((Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar5 != (Err *)0x0;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_4);
    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ != 0) goto LAB_02468a86;
    instrs<wasm::WATParser::ParseModuleTypesCtx>((Result<wasm::Ok> *)&err_5,ctx);
    local_3a8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_5);
    bVar2 = local_3a8 != (Err *)0x0;
    if (bVar2) {
      wasm::Err::Err(&local_3c8,local_3a8);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_3c8);
      wasm::Err::~Err(&local_3c8);
    }
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar2;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_5);
    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ != 0) goto LAB_02468a86;
    if ((folded) && (bVar2 = Lexer::takeRParen(&ctx->in), !bVar2)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,"expected \')\' at end of else block",&local_409);
      Lexer::err(&local_3e8,&ctx->in,&local_408);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_3e8);
      wasm::Err::~Err(&local_3e8);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator(&local_409);
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
      goto LAB_02468a86;
    }
  }
  else {
LAB_02468175:
    if (!folded) {
      join_0x00000010_0x00000000_ = sv("else",4);
      bVar2 = Lexer::takeKeyword(&ctx->in,join_0x00000010_0x00000000_);
      if (bVar2) goto LAB_024681de;
    }
  }
  if (folded) {
    bVar2 = Lexer::takeRParen(&ctx->in);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_450,"expected \')\' at end of if",&local_451);
      Lexer::err(&local_430,&ctx->in,&local_450);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_430);
      wasm::Err::~Err(&local_430);
      std::__cxx11::string::~string((string *)&local_450);
      std::allocator<char>::~allocator(&local_451);
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
      goto LAB_02468a86;
    }
  }
  else {
    local_468 = sv("end",3);
    bVar2 = Lexer::takeKeyword(&ctx->in,local_468);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,"expected \'end\' at end of if",
                 (allocator<char> *)
                 &id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>.field_0x17);
      Lexer::err(&local_488,&ctx->in,&local_4a8);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_488);
      wasm::Err::~Err(&local_488);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &id2.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>.field_0x17);
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
      goto LAB_02468a86;
    }
    Lexer::takeID((optional<wasm::Name> *)local_4c8,&ctx->in);
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_4c8);
    if ((bVar2) &&
       (_Var3 = std::operator!=((optional<wasm::Name> *)local_4c8,
                                (optional<wasm::Name> *)
                                ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                                        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20)),
       _Var3)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_508,"end label does not match if label",&local_509);
      Lexer::err(&local_4e8,&ctx->in,&local_508);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_4e8);
      wasm::Err::~Err(&local_4e8);
      std::__cxx11::string::~string((string *)&local_508);
      std::allocator<char>::~allocator(&local_509);
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
      goto LAB_02468a86;
    }
  }
  NullInstrParserCtx::visitEnd(&local_538,(NullInstrParserCtx *)ctx);
  MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_538);
  Result<wasm::Ok>::~Result(&local_538);
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _36_4_ = 1;
LAB_02468a86:
  Result<wasm::HeapType>::~Result
            ((Result<wasm::HeapType> *)
             ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<>
ifelse(Ctx& ctx, const std::vector<Annotation>& annotations, bool folded) {
  auto pos = ctx.in.getPos();

  if ((folded && !ctx.in.takeSExprStart("if"sv)) ||
      (!folded && !ctx.in.takeKeyword("if"sv))) {
    return {};
  }

  auto label = ctx.in.takeID();

  auto type = blocktype(ctx);
  CHECK_ERR(type);

  if (folded) {
    CHECK_ERR(foldedinstrs(ctx));
    ctx.setSrcLoc(annotations);
  }

  CHECK_ERR(ctx.makeIf(pos, annotations, label, *type));

  if (folded && !ctx.in.takeSExprStart("then"sv)) {
    return ctx.in.err("expected 'then' before if instructions");
  }

  CHECK_ERR(instrs(ctx));

  if (folded && !ctx.in.takeRParen()) {
    return ctx.in.err("expected ')' at end of then block");
  }

  if ((folded && ctx.in.takeSExprStart("else"sv)) ||
      (!folded && ctx.in.takeKeyword("else"sv))) {
    auto id1 = ctx.in.takeID();
    if (id1 && id1 != label) {
      return ctx.in.err("else label does not match if label");
    }

    CHECK_ERR(ctx.visitElse());

    CHECK_ERR(instrs(ctx));

    if (folded && !ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of else block");
    }
  }

  if (folded) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of if");
    }
  } else {
    if (!ctx.in.takeKeyword("end"sv)) {
      return ctx.in.err("expected 'end' at end of if");
    }
    auto id2 = ctx.in.takeID();
    if (id2 && id2 != label) {
      return ctx.in.err("end label does not match if label");
    }
  }

  return ctx.visitEnd();
}